

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::transform
          (LightNodeImpl<embree::SceneGraph::DistantLight> *this,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  _func_int *p_Var17;
  _func_int *p_Var18;
  _func_int **pp_Var19;
  float *in_RDX;
  float __x;
  float fVar20;
  
  pp_Var19 = (_func_int **)alignedMalloc(0xb0,0x10);
  fVar2 = space[2].l.vx.field_0.m128[0];
  fVar3 = space[2].l.vx.field_0.m128[1];
  fVar4 = space[2].l.vx.field_0.m128[2];
  fVar5 = in_RDX[8];
  fVar6 = in_RDX[9];
  fVar7 = in_RDX[10];
  fVar8 = in_RDX[0xb];
  fVar9 = in_RDX[4];
  fVar10 = in_RDX[5];
  fVar11 = in_RDX[6];
  fVar12 = in_RDX[7];
  fVar13 = *in_RDX;
  fVar14 = in_RDX[1];
  fVar15 = in_RDX[2];
  fVar16 = in_RDX[3];
  fVar1 = space[2].l.vz.field_0.m128[0];
  p_Var17 = *(_func_int **)&space[2].l.vy.field_0;
  p_Var18 = *(_func_int **)((long)&space[2].l.vy.field_0 + 8);
  __x = fVar1 * 0.017453292;
  fVar20 = cosf(__x);
  pp_Var19[1] = (_func_int *)0x0;
  pp_Var19[2] = (_func_int *)(pp_Var19 + 4);
  pp_Var19[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var19 + 4) = 0;
  pp_Var19[6] = (_func_int *)(pp_Var19 + 8);
  pp_Var19[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var19 + 8) = 0;
  pp_Var19[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var19 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var19 + 0x5c) = 0xffffffff;
  pp_Var19[0xc] = (_func_int *)0x0;
  *pp_Var19 = (_func_int *)&PTR__Node_002c69e8;
  *(undefined4 *)(pp_Var19 + 0xe) = 4;
  pp_Var19[0x10] =
       (_func_int *)
       CONCAT44(fVar2 * fVar14 + fVar3 * fVar10 + fVar4 * fVar6,
                fVar2 * fVar13 + fVar3 * fVar9 + fVar4 * fVar5);
  pp_Var19[0x11] =
       (_func_int *)
       CONCAT44(fVar2 * fVar16 + fVar3 * fVar12 + fVar4 * fVar8,
                fVar2 * fVar15 + fVar3 * fVar11 + fVar4 * fVar7);
  pp_Var19[0x12] = p_Var17;
  pp_Var19[0x13] = p_Var18;
  *(float *)(pp_Var19 + 0x14) = fVar1;
  *(float *)((long)pp_Var19 + 0xa4) = __x;
  *(float *)(pp_Var19 + 0x15) = fVar20;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var19;
  LOCK();
  pp_Var19[1] = pp_Var19[1] + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }